

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollAdapterBase.cpp
# Opt level: O1

void __thiscall
cursespp::ScrollAdapterBase::DrawPage
          (ScrollAdapterBase *this,ScrollableWindow *scrollable,size_t index,ScrollPosition *result)

{
  ulong uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar7;
  reference pvVar8;
  undefined4 extraout_var_01;
  undefined8 uVar9;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  result_00;
  ulong uVar10;
  ulong uVar11;
  shared_ptr<cursespp::IScrollAdapter::IEntry> *__args_3;
  size_t sVar12;
  size_type __n;
  string line;
  deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  visible;
  _Any_data local_130;
  shared_ptr<cursespp::IScrollAdapter::IEntry> local_120;
  shared_ptr<cursespp::IScrollAdapter::IEntry> *local_110;
  size_type local_108;
  ScrollableWindow *local_100;
  ulong local_f8;
  ScrollAdapterBase *local_f0;
  utf8 *local_e8;
  long local_e0;
  long local_d8 [2];
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  ulong local_b8;
  ScrollPosition *local_b0;
  size_t local_a8;
  ScrollableWindow *local_a0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_98;
  ulong local_90;
  _Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
  local_88;
  long lVar6;
  
  local_b0 = result;
  iVar4 = (*(scrollable->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x22])
                    (scrollable);
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_100 = scrollable;
  iVar4 = (*(scrollable->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x23])
                    (scrollable);
  if ((((lVar6 != 0) && ((char)iVar4 != '\0')) && (this->height != 0)) && (this->width != 0)) {
    werase(lVar6);
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::
    _Deque_base<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::_M_initialize_map(&local_88,0);
    iVar4 = (*(this->super_IScrollAdapter)._vptr_IScrollAdapter[3])(this);
    local_b8 = CONCAT44(extraout_var_00,iVar4);
    if (local_b8 == 0) {
      sVar7 = 0;
      sVar12 = 0;
    }
    else {
      sVar7 = local_b8 - 1;
      if (index < local_b8) {
        sVar7 = index;
      }
      sVar7 = GetVisibleItems(this,local_100,sVar7,
                              (deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                               *)&local_88);
      local_a0 = (ScrollableWindow *)&this->decorator;
      sVar12 = 0;
      __n = 0;
      local_f0 = this;
      local_a8 = sVar7;
      while (result_00.container =
                  (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  (((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                    1) + (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                (_Map_pointer)0x0)) * 0x20),
            __n < (ulong)((long)&((result_00.container)->_M_dataplus)._M_p +
                         ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
                          (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                         ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 4))) {
        local_108 = __n;
        pvVar8 = std::
                 deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                 ::at((deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                       *)&local_88,__n);
        peVar2 = (pvVar8->
                 super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        this_00 = (pvVar8->
                  super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        iVar4 = (*peVar2->_vptr_IEntry[2])(peVar2);
        local_f8 = CONCAT44(extraout_var_01,iVar4);
        wmove(lVar6,sVar12 & 0xffffffff,0);
        if ((local_f8 != 0) && (sVar12 < this->height)) {
          local_98 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     (local_108 + sVar7);
          uVar10 = 1;
          local_90 = sVar12;
          do {
            __args_3 = (shared_ptr<cursespp::IScrollAdapter::IEntry> *)(uVar10 - 1);
            if ((this->decorator).super__Function_base._M_manager == (_Manager_type)0x0) {
              uVar9 = (shared_ptr<cursespp::IScrollAdapter::IEntry> *)0xffffffffffffffff;
            }
            else {
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_00->_M_use_count = this_00->_M_use_count + 1;
                }
              }
              result_00.container = local_98;
              local_c8 = peVar2;
              local_c0 = this_00;
              std::
              function<cursespp::Color_(cursespp::ScrollableWindow_*,_unsigned_long,_unsigned_long,_std::shared_ptr<cursespp::IScrollAdapter::IEntry>)>
              ::operator()((function<cursespp::Color_(cursespp::ScrollableWindow_*,_unsigned_long,_unsigned_long,_std::shared_ptr<cursespp::IScrollAdapter::IEntry>)>
                            *)&local_130,local_a0,(unsigned_long)local_100,(unsigned_long)local_98,
                           __args_3);
              uVar9 = local_130._M_unused._0_8_;
              if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_110 = __args_3;
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
                __args_3 = local_110;
              }
            }
            if ((shared_ptr<cursespp::IScrollAdapter::IEntry> *)uVar9 ==
                (shared_ptr<cursespp::IScrollAdapter::IEntry> *)0xffffffffffffffff) {
              (*peVar2->_vptr_IEntry[5])(&local_130,peVar2,__args_3);
              uVar9 = local_130._M_unused._0_8_;
            }
            if ((shared_ptr<cursespp::IScrollAdapter::IEntry> *)uVar9 !=
                (shared_ptr<cursespp::IScrollAdapter::IEntry> *)0xffffffffffffffff) {
              wattr_on(lVar6,uVar9 & 0xffffffff,0);
            }
            local_110 = (shared_ptr<cursespp::IScrollAdapter::IEntry> *)uVar9;
            (*peVar2->_vptr_IEntry[3])(&local_e8,peVar2,__args_3);
            local_130._8_8_ = 0;
            local_120.
            super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
            _0_4_ = 0;
            local_130._M_unused._M_object = &local_120;
            utf8::
            utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (local_e8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_e8 + local_e0),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&local_130,result_00);
            iVar5 = wcswidth((wchar_t *)local_130._M_unused._0_8_,local_130._8_8_);
            iVar4 = (int)local_e0;
            if ((shared_ptr<cursespp::IScrollAdapter::IEntry> *)local_130._M_unused._0_8_ !=
                &local_120) {
              operator_delete(local_130._M_unused._M_object,
                              CONCAT44(local_120.
                                       super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._4_4_,
                                       local_120.
                                       super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._0_4_) * 4 + 4);
            }
            uVar3 = local_90;
            if (0 < iVar5) {
              iVar4 = iVar5;
            }
            iVar4 = (int)local_f0->width - iVar4;
            if (0 < iVar4) {
              local_130._M_unused._M_object = &local_120;
              std::__cxx11::string::_M_construct((ulong)&local_130,(char)iVar4);
              std::__cxx11::string::_M_append
                        ((char *)&local_e8,local_130._M_unused._M_member_pointer);
              if ((shared_ptr<cursespp::IScrollAdapter::IEntry> *)local_130._M_unused._0_8_ !=
                  &local_120) {
                operator_delete(local_130._M_unused._M_object,
                                CONCAT44(local_120.
                                         super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._4_4_,
                                         local_120.
                                         super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr._0_4_) + 1);
              }
            }
            wprintw(lVar6,"%s",local_e8);
            if (local_110 != (shared_ptr<cursespp::IScrollAdapter::IEntry> *)0xffffffffffffffff) {
              wattr_off(lVar6,local_110,0);
            }
            this = local_f0;
            if (local_e8 != (utf8 *)local_d8) {
              operator_delete(local_e8,local_d8[0] + 1);
            }
            uVar1 = uVar10 + 1;
          } while ((uVar10 < local_f8) &&
                  (uVar11 = uVar10 + uVar3, uVar10 = uVar1, uVar11 < this->height));
          sVar12 = (uVar3 + uVar1) - 1;
          sVar7 = local_a8;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        __n = local_108 + 1;
      }
    }
    local_b0->visibleEntryCount =
         ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
          (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
         ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
          (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
         ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
         (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
         0x20;
    local_b0->firstVisibleEntryIndex = sVar7;
    local_b0->lineCount = sVar12;
    local_b0->totalEntries = local_b8;
    std::
    deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
    ::~deque((deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
              *)&local_88);
  }
  return;
}

Assistant:

void ScrollAdapterBase::DrawPage(ScrollableWindow* scrollable, size_t index, ScrollPosition& result) {
    WINDOW* window = scrollable->GetContent();

    if (!scrollable->IsVisible() || !window || this->height == 0 || this->width == 0) {
        return;
    }

    werase(window);

    std::deque<EntryPtr> visible;
    size_t drawnLines = 0;
    size_t topIndex = 0;
    size_t count = GetEntryCount();

    if (count > 0) {
        if (index >= count) {
            index = count - 1;
        }

        topIndex = GetVisibleItems(scrollable, index, visible);

        for (size_t e = 0; e < visible.size(); e++) {
            EntryPtr entry = visible.at(e);
            size_t count = entry->GetLineCount();
            wmove(window, drawnLines, 0);

            for (size_t i = 0; i < count && drawnLines < this->height; i++) {
                Color attrs = Color::Default;

                if (this->decorator) {
                    attrs = this->decorator(scrollable, topIndex + e, i, entry);
                }

                if (attrs == -1) {
                    attrs = entry->GetAttrs(i);
                }

                if (attrs != -1) {
                    wattron(window, attrs);
                }

                std::string line = entry->GetLine(i);
                size_t len = u8cols(line);

                /* pad with empty spaces to the end of the line. this allows us to
                do highlight rows. this should probably be configurable. */

                int remain = this->width - len;
                if (remain > 0) {
                    line += std::string(remain, ' ');
                }

                /* string is padded above, we don't need a \n */
                checked_wprintw(window, "%s", line.c_str());

                if (attrs != -1) {
                    wattroff(window, attrs);
                }

                ++drawnLines;
            }
        }
    }

    result.visibleEntryCount = visible.size();
    result.firstVisibleEntryIndex = topIndex;
    result.lineCount = drawnLines;
    result.totalEntries = count;
}